

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmd.c
# Opt level: O0

void set_occupation(_func_int *fn,char *txt,int xtime)

{
  int xtime_local;
  char *txt_local;
  _func_int *fn_local;
  
  occupation = fn;
  if (xtime != 0) {
    occupation = timed_occupation;
    timed_occ_fn = fn;
  }
  occtxt = txt;
  occtime = 0;
  return;
}

Assistant:

void set_occupation(int (*fn)(void), const char *txt, int xtime)
{
	if (xtime) {
		occupation = timed_occupation;
		timed_occ_fn = fn;
	} else
		occupation = fn;
	occtxt = txt;
	occtime = 0;
	return;
}